

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitOperand
          (InstructionDisassembler *this,ostream *stream,spv_parsed_instruction_t *inst,
          uint16_t operand_index)

{
  spv_parsed_operand_t *operand;
  Op opcode;
  spv_parsed_operand_t *psVar1;
  char cVar2;
  bool bVar3;
  spv_result_t sVar4;
  ostream *poVar5;
  spv_operand_type_t type;
  size_type sVar6;
  spv_operand_desc entry;
  size_type local_48;
  
  if (inst->num_operands <= operand_index) {
    __assert_fail("operand_index < inst.num_operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                  ,0x358,
                  "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                 );
  }
  psVar1 = inst->operands;
  operand = psVar1 + operand_index;
  opcode = inst->words[psVar1[operand_index].offset];
  type = psVar1[operand_index].type;
  switch(type) {
  case SPV_OPERAND_TYPE_ID:
  case SPV_OPERAND_TYPE_TYPE_ID:
  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
  case SPV_OPERAND_TYPE_SCOPE_ID:
    SetYellow(this,stream);
    poVar5 = std::operator<<(stream,"%");
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry,
                 &this->name_mapper_,opcode);
    std::operator<<(poVar5,(string *)&entry);
    goto LAB_0019ba53;
  case SPV_OPERAND_TYPE_RESULT_ID:
    __assert_fail("false && \"<result-id> is not supposed to be handled here\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                  ,0x35d,
                  "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                 );
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
    SetRed(this,stream);
    EmitNumericLiteral(stream,inst,operand);
    ResetColor(this,stream);
    goto LAB_0019b8c4;
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    SetRed(this,stream);
    sVar4 = AssemblyGrammar::lookupExtInst
                      (this->grammar_,inst->ext_inst_type,opcode,(spv_ext_inst_desc *)&entry);
    if (sVar4 != SPV_SUCCESS) {
      bVar3 = spvExtInstIsNonSemantic(inst->ext_inst_type);
      if (!bVar3) {
        __assert_fail("false && \"should have caught this earlier\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                      ,0x370,
                      "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                     );
      }
      std::ostream::_M_insert<unsigned_long>((ulong)stream);
      goto LAB_0019b8c4;
    }
    break;
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    sVar4 = AssemblyGrammar::lookupOpcode(this->grammar_,opcode,(spv_opcode_desc *)&entry);
    if (sVar4 != SPV_SUCCESS) {
      __assert_fail("false && \"should have caught this earlier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x37a,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
    SetRed(this,stream);
    break;
  case SPV_OPERAND_TYPE_LITERAL_STRING:
    std::operator<<(stream,"\"");
    SetGreen(this,stream);
    spvDecodeLiteralStringOperand_abi_cxx11_((string *)&entry,inst,operand_index);
    for (sVar6 = 0; local_48 != sVar6; sVar6 = sVar6 + 1) {
      cVar2 = *(char *)((long)entry->operandTypes + (sVar6 - 0x38));
      if ((cVar2 == '\\') || (cVar2 == '\"')) {
        std::operator<<(stream,'\\');
        cVar2 = *(char *)((long)entry->operandTypes + (sVar6 - 0x38));
      }
      std::operator<<(stream,cVar2);
    }
    ResetColor(this,stream);
    std::operator<<(stream,'\"');
LAB_0019ba53:
    std::__cxx11::string::_M_dispose();
    goto LAB_0019b8c4;
  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
  case SPV_OPERAND_TYPE_MEMORY_MODEL:
  case SPV_OPERAND_TYPE_EXECUTION_MODE:
  case SPV_OPERAND_TYPE_STORAGE_CLASS:
  case SPV_OPERAND_TYPE_DIMENSIONALITY:
  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
  case SPV_OPERAND_TYPE_DECORATION:
  case SPV_OPERAND_TYPE_BUILT_IN:
  case SPV_OPERAND_TYPE_GROUP_OPERATION:
  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
  case SPV_OPERAND_TYPE_CAPABILITY:
  case SPV_OPERAND_TYPE_FPENCODING:
  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
  case SPV_OPERAND_TYPE_FPDENORM_MODE:
  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
  case SPV_OPERAND_TYPE_RAY_FLAGS:
  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
    sVar4 = AssemblyGrammar::lookupOperand(this->grammar_,type,opcode,&entry);
    if (sVar4 != SPV_SUCCESS) {
      __assert_fail("false && \"should have caught this earlier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x3b9,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
    break;
  default:
    bVar3 = spvOperandIsConcreteMask(type);
    type = operand->type;
    if (bVar3) goto LAB_0019b8e4;
    bVar3 = spvOperandIsConcrete(type);
    if (!bVar3) {
      __assert_fail("false && \"unhandled or invalid case\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x3d0,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
    sVar4 = AssemblyGrammar::lookupOperand(this->grammar_,operand->type,opcode,&entry);
    if (sVar4 != SPV_SUCCESS) {
      __assert_fail("false && \"should have caught this earlier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x3cd,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
    break;
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
LAB_0019b8e4:
    EmitMaskOperand(this,stream,type,opcode);
    goto LAB_0019b8c4;
  }
  std::operator<<(stream,entry->name);
LAB_0019b8c4:
  ResetColor(this,stream);
  return;
}

Assistant:

void InstructionDisassembler::EmitOperand(std::ostream& stream,
                                          const spv_parsed_instruction_t& inst,
                                          const uint16_t operand_index) const {
  assert(operand_index < inst.num_operands);
  const spv_parsed_operand_t& operand = inst.operands[operand_index];
  const uint32_t word = inst.words[operand.offset];
  switch (operand.type) {
    case SPV_OPERAND_TYPE_RESULT_ID:
      assert(false && "<result-id> is not supposed to be handled here");
      SetBlue(stream);
      stream << "%" << name_mapper_(word);
      break;
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_TYPE_ID:
    case SPV_OPERAND_TYPE_SCOPE_ID:
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      SetYellow(stream);
      stream << "%" << name_mapper_(word);
      break;
    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER: {
      spv_ext_inst_desc ext_inst;
      SetRed(stream);
      if (grammar_.lookupExtInst(inst.ext_inst_type, word, &ext_inst) ==
          SPV_SUCCESS) {
        stream << ext_inst->name;
      } else {
        if (!spvExtInstIsNonSemantic(inst.ext_inst_type)) {
          assert(false && "should have caught this earlier");
        } else {
          // for non-semantic instruction sets we can just print the number
          stream << word;
        }
      }
    } break;
    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER: {
      spv_opcode_desc opcode_desc;
      if (grammar_.lookupOpcode(spv::Op(word), &opcode_desc))
        assert(false && "should have caught this earlier");
      SetRed(stream);
      stream << opcode_desc->name;
    } break;
    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
    case SPV_OPERAND_TYPE_LITERAL_FLOAT: {
      SetRed(stream);
      EmitNumericLiteral(&stream, inst, operand);
      ResetColor(stream);
    } break;
    case SPV_OPERAND_TYPE_LITERAL_STRING: {
      stream << "\"";
      SetGreen(stream);

      std::string str = spvDecodeLiteralStringOperand(inst, operand_index);
      for (char const& c : str) {
        if (c == '"' || c == '\\') stream << '\\';
        stream << c;
      }
      ResetColor(stream);
      stream << '"';
    } break;
    case SPV_OPERAND_TYPE_CAPABILITY:
    case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
    case SPV_OPERAND_TYPE_EXECUTION_MODEL:
    case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
    case SPV_OPERAND_TYPE_MEMORY_MODEL:
    case SPV_OPERAND_TYPE_EXECUTION_MODE:
    case SPV_OPERAND_TYPE_STORAGE_CLASS:
    case SPV_OPERAND_TYPE_DIMENSIONALITY:
    case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
    case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
    case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
    case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
    case SPV_OPERAND_TYPE_LINKAGE_TYPE:
    case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
    case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
    case SPV_OPERAND_TYPE_DECORATION:
    case SPV_OPERAND_TYPE_BUILT_IN:
    case SPV_OPERAND_TYPE_GROUP_OPERATION:
    case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
    case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
    case SPV_OPERAND_TYPE_RAY_FLAGS:
    case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
    case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
    case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
    case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
    case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
    case SPV_OPERAND_TYPE_DEBUG_OPERATION:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
    case SPV_OPERAND_TYPE_FPDENORM_MODE:
    case SPV_OPERAND_TYPE_FPOPERATION_MODE:
    case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
    case SPV_OPERAND_TYPE_FPENCODING:
    case SPV_OPERAND_TYPE_OVERFLOW_MODES: {
      spv_operand_desc entry;
      if (grammar_.lookupOperand(operand.type, word, &entry))
        assert(false && "should have caught this earlier");
      stream << entry->name;
    } break;
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
      EmitMaskOperand(stream, operand.type, word);
      break;
    default:
      if (spvOperandIsConcreteMask(operand.type)) {
        EmitMaskOperand(stream, operand.type, word);
      } else if (spvOperandIsConcrete(operand.type)) {
        spv_operand_desc entry;
        if (grammar_.lookupOperand(operand.type, word, &entry))
          assert(false && "should have caught this earlier");
        stream << entry->name;
      } else {
        assert(false && "unhandled or invalid case");
      }
      break;
  }
  ResetColor(stream);
}